

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  bool bVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  undefined4 uVar14;
  int iVar15;
  uint uVar16;
  size_t *psVar17;
  long lVar18;
  size_t sVar19;
  long lVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  float fVar40;
  undefined1 auVar39 [16];
  float fVar42;
  float fVar43;
  undefined1 auVar41 [16];
  float fVar44;
  float fVar46;
  float fVar47;
  undefined1 auVar45 [16];
  float fVar48;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  size_t local_1c0;
  size_t local_1b8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ulong local_120;
  anon_class_16_2_07cfa4d6 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar24._8_8_ = 0;
  auVar24._0_4_ =
       (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar24._4_4_ =
       (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar27._8_8_ = 0;
  auVar27._0_4_ = time_range->lower;
  auVar27._4_4_ = time_range->upper;
  auVar25 = vcmpps_avx(auVar24,auVar27,1);
  auVar36 = vinsertps_avx(auVar27,auVar24,0x50);
  auVar24 = vinsertps_avx(auVar24,auVar27,0x50);
  local_b8 = vblendvps_avx(auVar24,auVar36,auVar25);
  auVar32 = ZEXT1664(local_b8);
  local_c8 = vmovshdup_avx(local_b8);
  auVar33 = ZEXT1664(local_c8);
  if (local_b8._0_4_ <= local_c8._0_4_) {
    uVar21 = r->_begin;
    local_168 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_178 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_188 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    local_198 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_1c0 = __return_storage_ptr__->end;
    if (uVar21 < r->_end) {
      auVar34 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar35 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      auVar37 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      auVar38 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      local_1b8 = k;
      do {
        BVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar25._8_8_ = 0;
        auVar25._0_4_ = BVar2.lower;
        auVar25._4_4_ = BVar2.upper;
        auVar25 = vmovshdup_avx(auVar25);
        fVar22 = BVar2.lower;
        fVar40 = auVar25._0_4_ - fVar22;
        uVar3 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar21);
        pBVar4 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 vertices.items;
        if ((ulong)(uVar3 + 3) < (pBVar4->super_RawBufferView).num) {
          fVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                  super_Geometry.fnumTimeSegments;
          auVar25 = ZEXT416((uint)(fVar1 * ((auVar32._0_4_ - fVar22) / fVar40) * 1.0000002));
          auVar25 = vroundss_avx(auVar25,auVar25,9);
          auVar25 = vmaxss_avx(auVar34._0_16_,auVar25);
          uVar10 = (uint)auVar25._0_4_;
          auVar25 = ZEXT416((uint)(fVar1 * ((auVar33._0_4_ - fVar22) / fVar40) * 0.99999976));
          auVar25 = vroundss_avx(auVar25,auVar25,10);
          auVar25 = vminss_avx(auVar25,ZEXT416((uint)fVar1));
          uVar16 = (uint)auVar25._0_4_;
          bVar6 = uVar16 < uVar10;
          if (uVar10 <= uVar16) {
            uVar11 = (ulong)(int)uVar10;
            psVar17 = &pBVar4[uVar11].super_RawBufferView.stride;
            do {
              pcVar5 = ((RawBufferView *)(psVar17 + -2))->ptr_ofs;
              sVar19 = *psVar17;
              lVar20 = sVar19 * (uVar3 + 1);
              lVar18 = sVar19 * (uVar3 + 2);
              lVar13 = sVar19 * (uVar3 + 3);
              auVar25 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + sVar19 * uVar3 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar20 + 0xc)),0x10);
              auVar25 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(pcVar5 + lVar18 + 0xc)),0x20);
              auVar25 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(pcVar5 + lVar13 + 0xc)),0x30);
              auVar25 = vandps_avx(auVar35._0_16_,auVar25);
              auVar36 = auVar37._0_16_;
              auVar25 = vcmpps_avx(auVar25,auVar36,5);
              if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar25[0xf] < '\0') {
LAB_012edd45:
                if (!bVar6) goto LAB_012ee1fe;
                break;
              }
              auVar27 = auVar38._0_16_;
              auVar25 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar19 * uVar3),auVar27,6);
              auVar24 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar19 * uVar3),auVar36,1);
              auVar25 = vandps_avx(auVar25,auVar24);
              uVar14 = vmovmskps_avx(auVar25);
              if ((~(byte)uVar14 & 7) != 0) goto LAB_012edd45;
              auVar25 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar20),auVar27,6);
              auVar24 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar20),auVar36,1);
              auVar25 = vandps_avx(auVar25,auVar24);
              uVar14 = vmovmskps_avx(auVar25);
              if ((~(byte)uVar14 & 7) != 0) goto LAB_012edd45;
              auVar25 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar18),auVar27,6);
              auVar24 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar18),auVar36,1);
              auVar25 = vandps_avx(auVar25,auVar24);
              uVar14 = vmovmskps_avx(auVar25);
              if ((~(byte)uVar14 & 7) != 0) goto LAB_012edd45;
              auVar25 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar13),auVar27,6);
              auVar36 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar13),auVar36,1);
              auVar25 = vandps_avx(auVar25,auVar36);
              uVar14 = vmovmskps_avx(auVar25);
              if ((~(byte)uVar14 & 7) != 0) goto LAB_012edd45;
              uVar11 = uVar11 + 1;
              psVar17 = psVar17 + 7;
              bVar6 = (ulong)(long)(int)uVar16 < uVar11;
            } while (uVar11 <= (ulong)(long)(int)uVar16);
          }
          local_118.primID = &local_120;
          fVar40 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                   super_Geometry.time_range.lower;
          fVar23 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                   super_Geometry.time_range.upper - fVar40;
          fVar28 = (auVar32._0_4_ - fVar40) / fVar23;
          fVar23 = (auVar33._0_4_ - fVar40) / fVar23;
          fVar40 = fVar1 * fVar28;
          fVar22 = fVar1 * fVar23;
          auVar24 = vroundss_avx(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40),9);
          auVar27 = vroundss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),10);
          auVar25 = vmaxss_avx(auVar24,auVar34._0_16_);
          auVar36 = vminss_avx(auVar27,ZEXT416((uint)fVar1));
          iVar15 = (int)auVar25._0_4_;
          fVar29 = auVar36._0_4_;
          uVar3 = (int)auVar24._0_4_;
          if ((int)auVar24._0_4_ < 0) {
            uVar3 = 0xffffffff;
          }
          iVar12 = (int)fVar1 + 1;
          if ((int)auVar27._0_4_ < (int)fVar1 + 1) {
            iVar12 = (int)auVar27._0_4_;
          }
          local_120 = uVar21;
          local_118.this = this;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_118,(long)iVar15);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_108.field_1,&local_118,(long)(int)fVar29);
          fVar40 = fVar40 - auVar25._0_4_;
          if (iVar12 - uVar3 == 1) {
            auVar25 = vmaxss_avx(ZEXT416((uint)fVar40),ZEXT816(0) << 0x40);
            auVar36 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar25 = vshufps_avx(auVar25,auVar25,0);
            auVar39._0_4_ = auVar36._0_4_ * local_108.m128[0] + auVar25._0_4_ * local_e8.m128[0];
            auVar39._4_4_ = auVar36._4_4_ * local_108.m128[1] + auVar25._4_4_ * local_e8.m128[1];
            auVar39._8_4_ = auVar36._8_4_ * local_108.m128[2] + auVar25._8_4_ * local_e8.m128[2];
            auVar39._12_4_ = auVar36._12_4_ * local_108.m128[3] + auVar25._12_4_ * local_e8.m128[3];
            auVar41._0_4_ = auVar36._0_4_ * local_f8 + auVar25._0_4_ * local_d8;
            auVar41._4_4_ = auVar36._4_4_ * fStack_f4 + auVar25._4_4_ * fStack_d4;
            auVar41._8_4_ = auVar36._8_4_ * fStack_f0 + auVar25._8_4_ * fStack_d0;
            auVar41._12_4_ = auVar36._12_4_ * fStack_ec + auVar25._12_4_ * fStack_cc;
            auVar25 = vmaxss_avx(ZEXT416((uint)(fVar29 - fVar22)),ZEXT816(0) << 0x40);
            auVar36 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar25 = vshufps_avx(auVar25,auVar25,0);
            auVar30._0_4_ = auVar25._0_4_ * local_108.m128[0] + auVar36._0_4_ * local_e8.m128[0];
            auVar30._4_4_ = auVar25._4_4_ * local_108.m128[1] + auVar36._4_4_ * local_e8.m128[1];
            auVar30._8_4_ = auVar25._8_4_ * local_108.m128[2] + auVar36._8_4_ * local_e8.m128[2];
            auVar30._12_4_ = auVar25._12_4_ * local_108.m128[3] + auVar36._12_4_ * local_e8.m128[3];
            auVar45._0_4_ = auVar25._0_4_ * local_f8 + auVar36._0_4_ * local_d8;
            auVar45._4_4_ = auVar25._4_4_ * fStack_f4 + auVar36._4_4_ * fStack_d4;
            auVar45._8_4_ = auVar25._8_4_ * fStack_f0 + auVar36._8_4_ * fStack_d0;
            auVar45._12_4_ = auVar25._12_4_ * fStack_ec + auVar36._12_4_ * fStack_cc;
            auVar25 = ZEXT416(0) << 0x20;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_118,(long)(iVar15 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_118,(long)((int)fVar29 + -1));
            auVar25 = vmaxss_avx(ZEXT416((uint)fVar40),ZEXT816(0) << 0x40);
            auVar36 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar25 = vshufps_avx(auVar25,auVar25,0);
            auVar39._0_4_ = auVar36._0_4_ * local_58.m128[0] + auVar25._0_4_ * local_e8.m128[0];
            auVar39._4_4_ = auVar36._4_4_ * local_58.m128[1] + auVar25._4_4_ * local_e8.m128[1];
            auVar39._8_4_ = auVar36._8_4_ * local_58.m128[2] + auVar25._8_4_ * local_e8.m128[2];
            auVar39._12_4_ = auVar36._12_4_ * local_58.m128[3] + auVar25._12_4_ * local_e8.m128[3];
            auVar41._0_4_ = auVar36._0_4_ * local_48 + auVar25._0_4_ * local_d8;
            auVar41._4_4_ = auVar36._4_4_ * fStack_44 + auVar25._4_4_ * fStack_d4;
            auVar41._8_4_ = auVar36._8_4_ * fStack_40 + auVar25._8_4_ * fStack_d0;
            auVar41._12_4_ = auVar36._12_4_ * fStack_3c + auVar25._12_4_ * fStack_cc;
            auVar25 = vmaxss_avx(ZEXT416((uint)(fVar29 - fVar22)),ZEXT816(0) << 0x40);
            auVar36 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar25 = vshufps_avx(auVar25,auVar25,0);
            auVar30._0_4_ = auVar36._0_4_ * local_78.m128[0] + auVar25._0_4_ * local_108.m128[0];
            auVar30._4_4_ = auVar36._4_4_ * local_78.m128[1] + auVar25._4_4_ * local_108.m128[1];
            auVar30._8_4_ = auVar36._8_4_ * local_78.m128[2] + auVar25._8_4_ * local_108.m128[2];
            auVar30._12_4_ = auVar36._12_4_ * local_78.m128[3] + auVar25._12_4_ * local_108.m128[3];
            auVar45._0_4_ = auVar36._0_4_ * local_68 + auVar25._0_4_ * local_f8;
            auVar45._4_4_ = auVar36._4_4_ * fStack_64 + auVar25._4_4_ * fStack_f4;
            auVar45._8_4_ = auVar36._8_4_ * fStack_60 + auVar25._8_4_ * fStack_f0;
            auVar45._12_4_ = auVar36._12_4_ * fStack_5c + auVar25._12_4_ * fStack_ec;
            if ((int)(uVar3 + 1) < iVar12) {
              sVar19 = (size_t)(uVar3 + 1);
              iVar12 = ~uVar3 + iVar12;
              do {
                auVar26._0_4_ = ((float)(int)sVar19 / fVar1 - fVar28) / (fVar23 - fVar28);
                auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar25 = vshufps_avx(auVar26,auVar26,0);
                local_1d8 = auVar30._0_4_;
                fStack_1d4 = auVar30._4_4_;
                fStack_1d0 = auVar30._8_4_;
                fStack_1cc = auVar30._12_4_;
                auVar36 = vshufps_avx(ZEXT416((uint)(1.0 - auVar26._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar26._0_4_)),0);
                fVar40 = auVar39._4_4_;
                fVar22 = auVar39._8_4_;
                fVar29 = auVar39._12_4_;
                fVar46 = auVar45._4_4_;
                fVar47 = auVar45._8_4_;
                fVar48 = auVar45._12_4_;
                fVar42 = auVar41._4_4_;
                fVar43 = auVar41._8_4_;
                fVar44 = auVar41._12_4_;
                local_a8 = auVar45._0_4_ * auVar25._0_4_ + auVar41._0_4_ * auVar36._0_4_;
                fStack_a4 = fVar46 * auVar25._4_4_ + fVar42 * auVar36._4_4_;
                fStack_a0 = fVar47 * auVar25._8_4_ + fVar43 * auVar36._8_4_;
                fStack_9c = fVar48 * auVar25._12_4_ + fVar44 * auVar36._12_4_;
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_118,sVar19);
                auVar9._4_4_ = auVar25._4_4_ * fStack_1d4 + fVar40 * auVar36._4_4_;
                auVar9._0_4_ = auVar25._0_4_ * local_1d8 + auVar39._0_4_ * auVar36._0_4_;
                auVar9._8_4_ = auVar25._8_4_ * fStack_1d0 + fVar22 * auVar36._8_4_;
                auVar9._12_4_ = auVar25._12_4_ * fStack_1cc + fVar29 * auVar36._12_4_;
                auVar25 = vsubps_avx((undefined1  [16])local_98,auVar9);
                auVar36._4_4_ = fStack_a4;
                auVar36._0_4_ = local_a8;
                auVar36._8_4_ = fStack_a0;
                auVar36._12_4_ = fStack_9c;
                auVar24 = vsubps_avx(local_88,auVar36);
                auVar36 = vminps_avx(auVar25,ZEXT816(0) << 0x40);
                auVar25 = vmaxps_avx(auVar24,ZEXT816(0) << 0x40);
                auVar39._0_4_ = auVar39._0_4_ + auVar36._0_4_;
                auVar39._4_4_ = fVar40 + auVar36._4_4_;
                auVar39._8_4_ = fVar22 + auVar36._8_4_;
                auVar39._12_4_ = fVar29 + auVar36._12_4_;
                auVar30._0_4_ = local_1d8 + auVar36._0_4_;
                auVar30._4_4_ = fStack_1d4 + auVar36._4_4_;
                auVar30._8_4_ = fStack_1d0 + auVar36._8_4_;
                auVar30._12_4_ = fStack_1cc + auVar36._12_4_;
                auVar41._0_4_ = auVar41._0_4_ + auVar25._0_4_;
                auVar41._4_4_ = fVar42 + auVar25._4_4_;
                auVar41._8_4_ = fVar43 + auVar25._8_4_;
                auVar41._12_4_ = fVar44 + auVar25._12_4_;
                auVar45._0_4_ = auVar45._0_4_ + auVar25._0_4_;
                auVar45._4_4_ = fVar46 + auVar25._4_4_;
                auVar45._8_4_ = fVar47 + auVar25._8_4_;
                auVar45._12_4_ = fVar48 + auVar25._12_4_;
                sVar19 = sVar19 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            auVar25 = ZEXT816(0) << 0x40;
          }
          auVar34 = ZEXT1664(auVar25);
          auVar25 = vcmpps_avx(auVar39,auVar41,2);
          uVar14 = vmovmskps_avx(auVar25);
          auVar32 = ZEXT1664(local_b8);
          auVar33 = ZEXT1664(local_c8);
          auVar35 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar37 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          auVar38 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          if ((~(byte)uVar14 & 7) == 0) {
            auVar25 = vcmpps_avx(auVar30,auVar45,2);
            uVar14 = vmovmskps_avx(auVar25);
            if ((~(byte)uVar14 & 7) == 0) {
              auVar25 = vminps_avx(auVar39,auVar30);
              aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar25,ZEXT416(geomID),0x30);
              auVar25 = vmaxps_avx(auVar41,auVar45);
              aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar25,ZEXT416((uint)uVar21),0x30);
              auVar31._0_4_ = aVar7.x + aVar8.x;
              auVar31._4_4_ = aVar7.y + aVar8.y;
              auVar31._8_4_ = aVar7.z + aVar8.z;
              auVar31._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
              local_168 = vminps_avx(local_168,(undefined1  [16])aVar7);
              local_178 = vmaxps_avx(local_178,(undefined1  [16])aVar8);
              local_188 = vminps_avx(local_188,auVar31);
              local_198 = vmaxps_avx(local_198,auVar31);
              local_1c0 = local_1c0 + 1;
              prims[local_1b8].lower.field_0.field_1 = aVar7;
              prims[local_1b8].upper.field_0.field_1 = aVar8;
              local_1b8 = local_1b8 + 1;
            }
          }
        }
LAB_012ee1fe:
        uVar21 = uVar21 + 1;
      } while (uVar21 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_168._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_178._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_178._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_188._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_198._8_8_;
    __return_storage_ptr__->end = local_1c0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }